

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.cpp
# Opt level: O2

float basisu::linear_to_srgb(float l)

{
  float fVar1;
  float fVar2;
  
  if ((0.0 <= l) && (l <= 1.0)) {
    if (0.0031308 <= l) {
      fVar1 = powf(l,0.41666666);
      fVar1 = fVar1 * 1.055 + -0.055;
    }
    else {
      fVar1 = l * 12.92;
    }
    fVar2 = 0.0;
    if ((0.0 <= fVar1) && (fVar2 = fVar1, 1.0 < fVar1)) {
      fVar2 = 1.0;
    }
    return fVar2;
  }
  __assert_fail("l >= 0.0f && l <= 1.0f",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.cpp"
                ,0x254,"float basisu::linear_to_srgb(float)");
}

Assistant:

float linear_to_srgb(float l)
	{
		assert(l >= 0.0f && l <= 1.0f);
		if (l < .0031308f)
			return saturate(l * 12.92f);
		else
			return saturate(1.055f * powf(l, 1.0f/2.4f) - .055f);
	}